

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O2

void h2v1_merged_upsample_565
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  jpeg_upsampler *pjVar5;
  JSAMPLE *pJVar6;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var7;
  long lVar8;
  _func_void_j_decompress_ptr *p_Var9;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var10;
  JSAMPROW pJVar11;
  JSAMPROW pJVar12;
  JSAMPROW pJVar13;
  JSAMPROW pJVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  
  pjVar5 = cinfo->upsample;
  pJVar6 = cinfo->sample_range_limit;
  p_Var7 = pjVar5[1].upsample;
  lVar8 = *(long *)&pjVar5[1].need_context_rows;
  p_Var9 = pjVar5[2].start_pass;
  p_Var10 = pjVar5[2].upsample;
  pJVar11 = (*input_buf)[in_row_group_ctr];
  pJVar12 = input_buf[1][in_row_group_ctr];
  pJVar13 = input_buf[2][in_row_group_ctr];
  pJVar14 = *output_buf;
  uVar4 = cinfo->output_width;
  for (lVar15 = 0; uVar4 >> 1 != (uint)lVar15; lVar15 = lVar15 + 1) {
    uVar19 = (ulong)pJVar12[lVar15];
    uVar16 = (ulong)pJVar13[lVar15];
    lVar21 = (long)*(int *)(p_Var7 + uVar16 * 4);
    uVar17 = (ulong)pJVar11[lVar15 * 2];
    lVar18 = (long)(int)((ulong)(*(long *)(p_Var9 + uVar16 * 8) + *(long *)(p_Var10 + uVar19 * 8))
                        >> 0x10);
    lVar20 = (long)*(int *)(lVar8 + uVar19 * 4);
    uVar16 = (ulong)pJVar11[lVar15 * 2 + 1];
    bVar1 = pJVar6[lVar21 + uVar16];
    bVar2 = pJVar6[lVar18 + uVar16];
    bVar3 = pJVar6[lVar20 + uVar16];
    *(ushort *)(pJVar14 + lVar15 * 4) =
         (ushort)(pJVar6[uVar17 + lVar20] >> 3) |
         (pJVar6[lVar21 + uVar17] & 0xfff8) * 0x100 + (pJVar6[uVar17 + lVar18] & 0xfc) * 8;
    *(ushort *)(pJVar14 + lVar15 * 4 + 2) =
         (ushort)(bVar3 >> 3) | (bVar1 & 0xfff8) * 0x100 + (bVar2 & 0xfc) * 8;
  }
  if ((uVar4 & 1) != 0) {
    uVar19 = (ulong)pJVar12[lVar15];
    uVar17 = (ulong)pJVar13[lVar15];
    uVar16 = (ulong)pJVar11[lVar15 * 2];
    *(ushort *)(pJVar14 + lVar15 * 4) =
         (ushort)(pJVar6[(long)*(int *)(lVar8 + uVar19 * 4) + uVar16] >> 3) |
         (pJVar6[(long)*(int *)(p_Var7 + uVar17 * 4) + uVar16] & 0xfff8) * 0x100 +
         (pJVar6[(long)(int)((ulong)(*(long *)(p_Var9 + uVar17 * 8) +
                                    *(long *)(p_Var10 + uVar19 * 8)) >> 0x10) + uVar16] & 0xfc) * 8;
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_merged_upsample_565(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                         JDIMENSION in_row_group_ctr, JSAMPARRAY output_buf)
{
  if (is_big_endian())
    h2v1_merged_upsample_565_be(cinfo, input_buf, in_row_group_ctr,
                                output_buf);
  else
    h2v1_merged_upsample_565_le(cinfo, input_buf, in_row_group_ctr,
                                output_buf);
}